

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid)

{
  uint node1;
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uStack_60;
  REF_BOOL has_side;
  REF_DBL edge_ratio;
  REF_NODE local_40;
  REF_EDGE ref_edge;
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar3 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar3 == 0) {
    local_40 = pRVar1;
    for (lVar7 = 0; lVar7 < ref_edge->n; lVar7 = lVar7 + 1) {
      uVar3 = ref_edge->e2n[lVar7 * 2];
      node1 = ref_edge->e2n[lVar7 * 2 + 1];
      uVar4 = ref_node_ratio(local_40,uVar3,node1,&edge_ratio);
      if (uVar4 != 0) {
        pcVar2 = "add ratio";
        uStack_60 = 0x34;
LAB_001d1067:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uStack_60,"ref_collapse_diagnostics",(ulong)uVar4,pcVar2 + 4);
        return uVar4;
      }
      if (edge_ratio < ref_grid->adapt->post_min_ratio + 0.1) {
        uVar4 = ref_cell_has_side(ref_cell,uVar3,node1,&has_side);
        if (uVar4 != 0) {
          pcVar2 = "qua side";
          uStack_60 = 0x36;
          goto LAB_001d1067;
        }
        uVar5 = 0;
        uVar6 = 0;
        if ((-1 < (int)uVar3) && ((int)uVar3 < ref_cell->ref_adj->nnode)) {
          uVar6 = (ulong)(ref_cell->ref_adj->first[uVar3] != -1);
        }
        if ((-1 < (int)node1) && ((int)node1 < ref_cell->ref_adj->nnode)) {
          uVar5 = (ulong)(ref_cell->ref_adj->first[node1] != -1);
        }
        printf("ratio %f bound nodes %d %d tri edge %d\n",edge_ratio,uVar6,uVar5,
               (ulong)(uint)has_side);
      }
    }
    uVar3 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x30
           ,"ref_collapse_diagnostics",(ulong)uVar3,"orig edges");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_DBL edge_ratio;
  REF_BOOL has_side;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio < 0.1 + ref_grid_adapt(ref_grid, post_min_ratio)) {
      RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side");
      printf("ratio %f bound nodes %d %d tri edge %d\n", edge_ratio,
             !ref_cell_node_empty(ref_cell, node0),
             !ref_cell_node_empty(ref_cell, node1), has_side);
    }
  }

  return REF_SUCCESS;
}